

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void h2v2_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JSAMPROW pJVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  iVar8 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  uVar5 = (ulong)cinfo->max_v_samp_factor;
  if (0 < (long)uVar5) {
    uVar6 = cinfo->image_width;
    if (0 < (int)(iVar8 * 2 - uVar6)) {
      uVar9 = 0;
      do {
        memset(input_data[uVar9] + uVar6,(uint)input_data[uVar9][(ulong)uVar6 - 1],
               (ulong)(iVar8 * 2 + ~uVar6) + 1);
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
      uVar5 = (ulong)(uint)cinfo->max_v_samp_factor;
    }
  }
  if (0 < (int)uVar5) {
    lVar10 = 0;
    lVar4 = 0;
    do {
      if (iVar8 != 0) {
        pJVar1 = input_data[lVar4];
        pJVar2 = input_data[lVar4 + 1];
        pJVar3 = output_data[lVar10];
        uVar6 = 1;
        lVar7 = 0;
        do {
          pJVar3[lVar7] =
               (JSAMPLE)(pJVar1[lVar7 * 2] + uVar6 +
                         (uint)pJVar2[lVar7 * 2] + (uint)pJVar1[lVar7 * 2 + 1] +
                         (uint)pJVar2[lVar7 * 2 + 1] >> 2);
          uVar6 = uVar6 ^ 3;
          lVar7 = lVar7 + 1;
        } while (iVar8 != (int)lVar7);
        uVar5 = (ulong)(uint)cinfo->max_v_samp_factor;
      }
      lVar4 = lVar4 + 2;
      lVar10 = lVar10 + 1;
    } while (lVar4 < (int)uVar5);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		 JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr0, inptr1, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * 2);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow+1];
    bias = 1;			/* bias = 1,2,1,2,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE) ((GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
			      GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1])
			      + bias) >> 2);
      bias ^= 3;		/* 1=>2, 2=>1 */
      inptr0 += 2; inptr1 += 2;
    }
    inrow += 2;
    outrow++;
  }
}